

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_getCParamsFromCCtxParams(ZSTD_CCtx_params *CCtxParams,U64 srcSizeHint,size_t dictSize)

{
  long in_RSI;
  ZSTD_compressionParameters *in_RDI;
  size_t in_stack_00000040;
  unsigned_long_long in_stack_00000048;
  int in_stack_00000054;
  
  ZSTD_getCParams(in_stack_00000054,in_stack_00000048,in_stack_00000040);
  if (*(int *)(in_RSI + 0x44) != 0) {
    in_RDI->windowLog = 0x1b;
  }
  if (*(int *)(in_RSI + 4) != 0) {
    in_RDI->windowLog = *(uint *)(in_RSI + 4);
  }
  if (*(int *)(in_RSI + 0xc) != 0) {
    in_RDI->hashLog = *(uint *)(in_RSI + 0xc);
  }
  if (*(int *)(in_RSI + 8) != 0) {
    in_RDI->chainLog = *(uint *)(in_RSI + 8);
  }
  if (*(int *)(in_RSI + 0x10) != 0) {
    in_RDI->searchLog = *(uint *)(in_RSI + 0x10);
  }
  if (*(int *)(in_RSI + 0x14) != 0) {
    in_RDI->searchLength = *(uint *)(in_RSI + 0x14);
  }
  if (*(int *)(in_RSI + 0x18) != 0) {
    in_RDI->targetLength = *(uint *)(in_RSI + 0x18);
  }
  if (*(int *)(in_RSI + 0x1c) != 0) {
    in_RDI->strategy = *(ZSTD_strategy *)(in_RSI + 0x1c);
  }
  return in_RDI;
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(
        const ZSTD_CCtx_params* CCtxParams, U64 srcSizeHint, size_t dictSize)
{
    ZSTD_compressionParameters cParams = ZSTD_getCParams(CCtxParams->compressionLevel, srcSizeHint, dictSize);
    if (CCtxParams->ldmParams.enableLdm) cParams.windowLog = ZSTD_LDM_DEFAULT_WINDOW_LOG;
    if (CCtxParams->cParams.windowLog) cParams.windowLog = CCtxParams->cParams.windowLog;
    if (CCtxParams->cParams.hashLog) cParams.hashLog = CCtxParams->cParams.hashLog;
    if (CCtxParams->cParams.chainLog) cParams.chainLog = CCtxParams->cParams.chainLog;
    if (CCtxParams->cParams.searchLog) cParams.searchLog = CCtxParams->cParams.searchLog;
    if (CCtxParams->cParams.searchLength) cParams.searchLength = CCtxParams->cParams.searchLength;
    if (CCtxParams->cParams.targetLength) cParams.targetLength = CCtxParams->cParams.targetLength;
    if (CCtxParams->cParams.strategy) cParams.strategy = CCtxParams->cParams.strategy;
    return cParams;
}